

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

QPDFExc * __thiscall QPDF::damagedPDF(QPDFExc *__return_storage_ptr__,QPDF *this,string *message)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  qpdf_offset_t offset;
  string *filename;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  offset = InputSource::getLastOffset
                     (((_Var1._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  filename = (string *)
             (**(code **)(**(long **)&(((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->file).
                                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                         0x18))();
  QPDFExc::QPDFExc(__return_storage_ptr__,qpdf_e_damaged_pdf,filename,
                   &(_Var1._M_head_impl)->last_object_description,offset,message,true);
  return __return_storage_ptr__;
}

Assistant:

QPDFExc
QPDF::damagedPDF(std::string const& message)
{
    return damagedPDF(m->last_object_description, m->file->getLastOffset(), message);
}